

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,_duckdb::interval_t,_duckdb::NotEquals,_false,_false,_true,_false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  bool bVar3;
  unsigned_long uVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  SelectionVector *in_RDX;
  bool comparison_result_1;
  idx_t ridx_1;
  idx_t lidx_1;
  idx_t result_idx_1;
  idx_t start;
  bool comparison_result;
  idx_t ridx;
  idx_t lidx;
  idx_t result_idx;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t false_count;
  idx_t true_count;
  interval_t *in_stack_ffffffffffffff38;
  uint7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff57;
  unsigned_long local_60;
  ulong local_58;
  ulong local_50;
  unsigned_long local_48;
  undefined8 local_40;
  idx_t local_38;
  unsigned_long local_20;
  SelectionVector *local_18;
  
  local_20 = CONCAT71(in_register_00000009,in_CL);
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_18 = in_RDX;
  local_50 = TemplatedValidityMask<unsigned_long>::EntryCount(0x2eca0a0);
  for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
    local_60 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                         (in_stack_ffffffffffffff48,
                          CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    uVar4 = MinValue<unsigned_long>(local_48 + 0x40,local_20);
    bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(local_60);
    if (bVar3) {
      for (; uVar2 = local_48, local_48 < uVar4; local_48 = local_48 + 1) {
        SelectionVector::get_index(local_18,local_48);
        bVar3 = NotEquals::Operation<duckdb::interval_t>
                          ((interval_t *)
                           CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff38);
        SelectionVector::set_index
                  ((SelectionVector *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   (idx_t)in_stack_ffffffffffffff48,
                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
        local_38 = bVar3 + local_38;
      }
    }
    else {
      bVar3 = TemplatedValidityMask<unsigned_long>::NoneValid(local_60);
      uVar1 = local_48;
      uVar2 = uVar4;
      if (!bVar3) {
        for (; uVar2 = local_48, local_48 < uVar4; local_48 = local_48 + 1) {
          SelectionVector::get_index(local_18,local_48);
          in_stack_ffffffffffffff48 = (TemplatedValidityMask<unsigned_long> *)(local_48 - uVar1);
          bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&local_60,(idx_t *)&stack0xffffffffffffff48);
          in_stack_ffffffffffffff47 = false;
          if (bVar3) {
            in_stack_ffffffffffffff47 =
                 NotEquals::Operation<duckdb::interval_t>
                           ((interval_t *)(ulong)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38
                           );
          }
          in_stack_ffffffffffffff57 = in_stack_ffffffffffffff47;
          SelectionVector::set_index
                    ((SelectionVector *)
                     CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff50),
                     (idx_t)in_stack_ffffffffffffff48,
                     CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
          local_38 = (in_stack_ffffffffffffff57 & 1) + local_38;
        }
      }
    }
    local_48 = uVar2;
  }
  return local_38;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}